

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall luna::CodeGenerateVisitor::LeaveLoop(CodeGenerateVisitor *this)

{
  Function *this_00;
  GenerateFunction *pGVar1;
  GenerateBlock *pGVar2;
  _List_node_base *p_Var3;
  int iVar4;
  size_t sVar5;
  Instruction *pIVar6;
  short sVar7;
  _Self __tmp;
  const_iterator __position;
  
  this_00 = this->current_function_->function_;
  sVar5 = Function::OpCodeSize(this_00);
  pGVar1 = this->current_function_;
  pGVar2 = pGVar1->current_block_;
  if ((pGVar2->current_loop_).loop_ast_ != (SyntaxTree *)0x0) {
    __position._M_node =
         (pGVar1->loop_jumps_).
         super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>._M_impl._M_node.
         super__List_node_base._M_next;
    while (__position._M_node != (_List_node_base *)&pGVar1->loop_jumps_) {
      if (__position._M_node[1]._M_next == (_List_node_base *)(pGVar2->current_loop_).loop_ast_) {
        if (*(int *)&__position._M_node[1]._M_prev == 0) {
          sVar7 = (short)(pGVar2->current_loop_).start_index_;
          iVar4 = *(int *)((long)&__position._M_node[1]._M_prev + 4);
LAB_0013f57d:
          sVar7 = sVar7 - (short)iVar4;
        }
        else {
          if (*(int *)&__position._M_node[1]._M_prev == 1) {
            iVar4 = *(int *)((long)&__position._M_node[1]._M_prev + 4);
            sVar7 = (short)sVar5;
            goto LAB_0013f57d;
          }
          iVar4 = *(int *)((long)&__position._M_node[1]._M_prev + 4);
          sVar7 = 0;
        }
        pIVar6 = Function::GetMutableInstruction(this_00,(long)iVar4);
        *(short *)&pIVar6->opcode_ = sVar7;
        p_Var3 = (__position._M_node)->_M_next;
        std::__cxx11::list<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>::erase
                  (&pGVar1->loop_jumps_,__position);
        __position._M_node = p_Var3;
      }
      else {
        __position._M_node = (__position._M_node)->_M_next;
      }
    }
  }
  return;
}

Assistant:

void LeaveLoop()
        {
            auto function = GetCurrentFunction();
            // Instruction index after loop
            int end_index = function->OpCodeSize();

            auto &loop = current_function_->current_block_->current_loop_;
            if (loop.loop_ast_)
            {
                auto &loop_jumps = current_function_->loop_jumps_;
                auto it = loop_jumps.begin();
                while (it != loop_jumps.end())
                {
                    if (it->loop_ast_ == loop.loop_ast_)
                    {
                        // Calculate diff between current index with index of destination
                        int diff = 0;
                        if (it->jump_type_ == LoopJumpInfo::JumpHead)
                            diff = loop.start_index_ - it->instruction_index_;
                        else if (it->jump_type_ == LoopJumpInfo::JumpTail)
                            diff = end_index - it->instruction_index_;

                        // Get instruction and refill its jump diff
                        auto i = function->GetMutableInstruction(it->instruction_index_);
                        i->RefillsBx(diff);

                        // Remove it from loop_jumps when it refilled
                        loop_jumps.erase(it++);
                    }
                    else
                        ++it;
                }
            }
        }